

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O2

void __thiscall
DScroller::DScroller
          (DScroller *this,EScroll type,double dx,double dy,int control,int affectee,int accel,
          EScrollPos scrollpos)

{
  side_t *psVar1;
  EScrollPos EVar2;
  TObjPtr<DInterpolation> TVar3;
  DInterpolation *pDVar4;
  double dVar5;
  double dVar6;
  
  DThinker::DThinker(&this->super_DThinker,0x20);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_006f6d90;
  this->m_Type = type;
  this->m_dx = dx;
  this->m_dy = dy;
  this->m_Accel = accel;
  this->m_Parts = scrollpos;
  this->m_vdy = 0.0;
  this->m_LastHeight = 0.0;
  this->m_vdx = 0.0;
  this->m_Control = control;
  if (control != -1) {
    dVar5 = sector_t::CenterFloor((sector_t *)(sectors + control));
    dVar6 = sector_t::CenterCeiling((sector_t *)(sectors + control));
    this->m_LastHeight = dVar5 + dVar6;
  }
  this->m_Affectee = affectee;
  this->m_Interpolations[0].field_0.p = (DInterpolation *)0x0;
  this->m_Interpolations[1].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
  this->m_Interpolations[2].field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)0x0;
  psVar1 = sides;
  switch(type) {
  case sc_side:
    sides[affectee].Flags = sides[affectee].Flags | 2;
    EVar2 = this->m_Parts;
    if ((EVar2 & scw_top) != 0) {
      pDVar4 = side_t::SetInterpolation(psVar1 + affectee,0);
      this->m_Interpolations[0].field_0.p = pDVar4;
      EVar2 = this->m_Parts;
    }
    if ((EVar2 & scw_mid) != 0) {
      if (((sides[this->m_Affectee].linedef)->backsector == (sector_t_conflict *)0x0) ||
         (((sides[this->m_Affectee].linedef)->flags & 0x200000) == 0)) {
        TVar3.field_0 =
             (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
             side_t::SetInterpolation(sides + this->m_Affectee,1);
        this->m_Interpolations[1].field_0 = TVar3.field_0;
        EVar2 = this->m_Parts;
      }
    }
    if ((EVar2 & scw_bottom) != 0) {
      TVar3.field_0 =
           (anon_union_8_2_947301c2_for_TObjPtr<DInterpolation>_1)
           side_t::SetInterpolation(sides + this->m_Affectee,2);
      this->m_Interpolations[2].field_0 = TVar3.field_0;
    }
    break;
  case sc_floor:
    pDVar4 = sector_t::SetInterpolation((sector_t *)(sectors + affectee),3,false);
    goto LAB_00441760;
  case sc_ceiling:
    pDVar4 = sector_t::SetInterpolation((sector_t *)(sectors + affectee),2,false);
LAB_00441760:
    this->m_Interpolations[0].field_0.p = pDVar4;
    break;
  case sc_carry:
    FLevelLocals::AddScroller(&level,affectee);
  }
  return;
}

Assistant:

DScroller::DScroller (EScroll type, double dx, double dy,
					  int control, int affectee, int accel, EScrollPos scrollpos)
	: DThinker (STAT_SCROLLER)
{
	m_Type = type;
	m_dx = dx;
	m_dy = dy;
	m_Accel = accel;
	m_Parts = scrollpos;
	m_vdx = m_vdy = 0;
	m_LastHeight = 0;
	if ((m_Control = control) != -1)
		m_LastHeight =
			sectors[control].CenterFloor () + sectors[control].CenterCeiling ();
	m_Affectee = affectee;
	m_Interpolations[0] = m_Interpolations[1] = m_Interpolations[2] = NULL;

	switch (type)
	{
	case EScroll::sc_carry:
		level.AddScroller (affectee);
		break;

	case EScroll::sc_side:
		sides[affectee].Flags |= WALLF_NOAUTODECALS;
		if (m_Parts & EScrollPos::scw_top)
		{
			m_Interpolations[0] = sides[m_Affectee].SetInterpolation(side_t::top);
		}
		if (m_Parts & EScrollPos::scw_mid && (sides[m_Affectee].linedef->backsector == NULL ||
			!(sides[m_Affectee].linedef->flags&ML_3DMIDTEX)))
		{
			m_Interpolations[1] = sides[m_Affectee].SetInterpolation(side_t::mid);
		}
		if (m_Parts & EScrollPos::scw_bottom)
		{
			m_Interpolations[2] = sides[m_Affectee].SetInterpolation(side_t::bottom);
		}
		break;

	case EScroll::sc_floor:
		m_Interpolations[0] = sectors[affectee].SetInterpolation(sector_t::FloorScroll, false);
		break;

	case EScroll::sc_ceiling:
		m_Interpolations[0] = sectors[affectee].SetInterpolation(sector_t::CeilingScroll, false);
		break;

	default:
		break;
	}
}